

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

int __thiscall
cmCPackGenerator::InstallProjectViaInstallScript
          (cmCPackGenerator *this,bool setDestDir,string *tempInstallDirectory)

{
  cmCPackLog *pcVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  ostream *poVar6;
  pointer filename;
  int local_214;
  string dir;
  char *local_1e8 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmakeScriptsVector;
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_INSTALL_SCRIPT",(allocator<char> *)&dir);
  pcVar5 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  local_214 = 1;
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,"- Install scripts: ");
    poVar6 = std::operator<<(poVar6,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x1c6,dir._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&dir);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    cmakeScriptsVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cmakeScriptsVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmakeScriptsVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,pcVar5,(allocator<char> *)&dir);
    cmSystemTools::ExpandListArgument((string *)&cmCPackLog_msg,&cmakeScriptsVector,false);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    pbVar2 = cmakeScriptsVector.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    filename = cmakeScriptsVector.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (filename == pbVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&cmakeScriptsVector);
        return 1;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,"- Install script: ");
      poVar6 = std::operator<<(poVar6,(string *)filename);
      std::endl<char,std::char_traits<char>>(poVar6);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x1cc,dir._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&dir);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      if (setDestDir) {
        dir._M_dataplus._M_p = (pointer)&dir.field_2;
        dir._M_string_length = 0;
        dir.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg,"CPACK_INSTALL_PREFIX",(allocator<char> *)local_1e8);
        pcVar5 = GetOption(this,(string *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        if (pcVar5 != (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCPackLog_msg,"CPACK_INSTALL_PREFIX",(allocator<char> *)local_1e8);
          GetOption(this,(string *)&cmCPackLog_msg);
          std::__cxx11::string::append((char *)&dir);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg,"CMAKE_INSTALL_PREFIX",(allocator<char> *)local_1e8);
        SetOption(this,(string *)&cmCPackLog_msg,dir._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,
                                 "- Using DESTDIR + CPACK_INSTALL_PREFIX... (this->SetOption)");
        std::endl<char,std::char_traits<char>>(poVar6);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x1dc,local_1e8[0]);
        std::__cxx11::string::~string((string *)local_1e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,"- Setting CMAKE_INSTALL_PREFIX to \'");
        poVar6 = std::operator<<(poVar6,(string *)&dir);
        poVar6 = std::operator<<(poVar6,"\'");
        std::endl<char,std::char_traits<char>>(poVar6);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x1df,local_1e8[0]);
        std::__cxx11::string::~string((string *)local_1e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&dir);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg,"CMAKE_INSTALL_PREFIX",(allocator<char> *)&dir);
        SetOption(this,(string *)&cmCPackLog_msg,(tempInstallDirectory->_M_dataplus)._M_p);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,
                                 "- Using non-DESTDIR install... (this->SetOption)");
        std::endl<char,std::char_traits<char>>(poVar6);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x1e5,dir._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&dir);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,"- Setting CMAKE_INSTALL_PREFIX to \'");
        poVar6 = std::operator<<(poVar6,(string *)tempInstallDirectory);
        poVar6 = std::operator<<(poVar6,"\'");
        std::endl<char,std::char_traits<char>>(poVar6);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x1e8,dir._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&dir);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CMAKE_CURRENT_BINARY_DIR",(allocator<char> *)&dir);
      SetOptionIfNotSet(this,(string *)&cmCPackLog_msg,(tempInstallDirectory->_M_dataplus)._M_p);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CMAKE_CURRENT_SOURCE_DIR",(allocator<char> *)&dir);
      SetOptionIfNotSet(this,(string *)&cmCPackLog_msg,(tempInstallDirectory->_M_dataplus)._M_p);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      bVar3 = cmMakefile::ReadListFile(this->MakefileMap,filename);
      bVar4 = cmSystemTools::GetErrorOccuredFlag();
      filename = filename + 1;
    } while (!bVar4 && bVar3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cmakeScriptsVector);
    local_214 = 0;
  }
  return local_214;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstallScript(
  bool setDestDir, const std::string& tempInstallDirectory)
{
  const char* cmakeScripts = this->GetOption("CPACK_INSTALL_SCRIPT");
  if (cmakeScripts && *cmakeScripts) {
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "- Install scripts: " << cmakeScripts << std::endl);
    std::vector<std::string> cmakeScriptsVector;
    cmSystemTools::ExpandListArgument(cmakeScripts, cmakeScriptsVector);
    for (std::string const& installScript : cmakeScriptsVector) {

      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                    "- Install script: " << installScript << std::endl);

      if (setDestDir) {
        // For DESTDIR based packaging, use the *project* CMAKE_INSTALL_PREFIX
        // underneath the tempInstallDirectory. The value of the project's
        // CMAKE_INSTALL_PREFIX is sent in here as the value of the
        // CPACK_INSTALL_PREFIX variable.

        std::string dir;
        if (this->GetOption("CPACK_INSTALL_PREFIX")) {
          dir += this->GetOption("CPACK_INSTALL_PREFIX");
        }
        this->SetOption("CMAKE_INSTALL_PREFIX", dir.c_str());
        cmCPackLogger(
          cmCPackLog::LOG_DEBUG,
          "- Using DESTDIR + CPACK_INSTALL_PREFIX... (this->SetOption)"
            << std::endl);
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "- Setting CMAKE_INSTALL_PREFIX to '" << dir << "'"
                                                            << std::endl);
      } else {
        this->SetOption("CMAKE_INSTALL_PREFIX", tempInstallDirectory.c_str());

        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "- Using non-DESTDIR install... (this->SetOption)"
                        << std::endl);
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "- Setting CMAKE_INSTALL_PREFIX to '"
                        << tempInstallDirectory << "'" << std::endl);
      }

      this->SetOptionIfNotSet("CMAKE_CURRENT_BINARY_DIR",
                              tempInstallDirectory.c_str());
      this->SetOptionIfNotSet("CMAKE_CURRENT_SOURCE_DIR",
                              tempInstallDirectory.c_str());
      bool res = this->MakefileMap->ReadListFile(installScript);
      if (cmSystemTools::GetErrorOccuredFlag() || !res) {
        return 0;
      }
    }
  }
  return 1;
}